

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Accumulator.hpp
# Opt level: O1

Vector<double,_3U> * __thiscall
OpenMD::Utils::Accumulator<OpenMD::Vector<double,_3U>_>::getStdDev
          (Vector<double,_3U> *__return_storage_ptr__,Accumulator<OpenMD::Vector<double,_3U>_> *this
          )

{
  size_t i;
  long lVar1;
  size_t i_1;
  double dVar2;
  double dVar3;
  Vector<double,_3U> variance;
  double local_28 [3];
  
  lVar1 = 0;
  __return_storage_ptr__->data_[2] = 0.0;
  __return_storage_ptr__->data_[0] = 0.0;
  __return_storage_ptr__->data_[1] = 0.0;
  local_28[2] = 0.0;
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  do {
    dVar2 = (this->Avg_).data_[lVar1];
    dVar3 = (this->Avg2_).data_[lVar1] - dVar2 * dVar2;
    dVar2 = 0.0;
    if (0.0 <= dVar3) {
      dVar2 = dVar3;
    }
    local_28[lVar1] = dVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    dVar2 = local_28[lVar1];
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    __return_storage_ptr__->data_[lVar1] = dVar2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return __return_storage_ptr__;
}

Assistant:

Vector<RealType, Dim> getStdDev() const {
      assert(Count_ != 0);

      Vector<RealType, Dim> sd {};
      Vector<RealType, Dim> variance = this->getVariance();

      for (std::size_t i = 0; i < Dim; i++) {
        sd[i] = std::sqrt(variance[i]);
      }

      return sd;
    }